

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>::
emplaceRealloc<slang::parsing::Preprocessor::BranchEntry>
          (SmallVectorBase<slang::parsing::Preprocessor::BranchEntry> *this,pointer pos,
          BranchEntry *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  size_type sVar4;
  Info *pIVar5;
  undefined8 uVar6;
  pointer pBVar7;
  pointer pBVar8;
  bool bVar9;
  bool bVar10;
  undefined5 uVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  pointer pBVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  uVar17 = this->len + 1;
  uVar3 = this->cap;
  if (uVar17 < uVar3 * 2) {
    uVar17 = uVar3 * 2;
  }
  if (0x555555555555555 - uVar3 < uVar3) {
    uVar17 = 0x555555555555555;
  }
  lVar18 = (long)pos - (long)this->data_;
  pBVar15 = (pointer)operator_new(uVar17 * 0x18);
  *(undefined8 *)((long)pBVar15 + lVar18 + 0x10) = *(undefined8 *)&args->anyTaken;
  pIVar5 = (args->directive).info;
  *(undefined8 *)((long)pBVar15 + lVar18) = *(undefined8 *)&args->directive;
  ((undefined8 *)((long)pBVar15 + lVar18))[1] = pIVar5;
  p = this->data_;
  sVar4 = this->len;
  lVar16 = (long)p + (sVar4 * 0x18 - (long)pos);
  pBVar7 = p;
  pBVar8 = pBVar15;
  if (lVar16 == 0) {
    if (sVar4 != 0) {
      lVar16 = 0;
      do {
        *(undefined8 *)(&pBVar15->anyTaken + lVar16) = *(undefined8 *)(&p->anyTaken + lVar16);
        puVar1 = (undefined8 *)((long)&(p->directive).kind + lVar16);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pBVar15->directive).kind + lVar16);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        lVar16 = lVar16 + 0x18;
      } while (sVar4 * 0x18 != lVar16);
    }
  }
  else {
    for (; pBVar7 != pos; pBVar7 = pBVar7 + 1) {
      bVar9 = pBVar7->currentActive;
      bVar10 = pBVar7->hasElse;
      uVar11 = *(undefined5 *)&pBVar7->field_0x13;
      pBVar8->anyTaken = pBVar7->anyTaken;
      pBVar8->currentActive = bVar9;
      pBVar8->hasElse = bVar10;
      *(undefined5 *)&pBVar8->field_0x13 = uVar11;
      uVar12 = (pBVar7->directive).field_0x2;
      NVar13.raw = (pBVar7->directive).numFlags.raw;
      uVar14 = (pBVar7->directive).rawLen;
      pIVar5 = (pBVar7->directive).info;
      (pBVar8->directive).kind = (pBVar7->directive).kind;
      (pBVar8->directive).field_0x2 = uVar12;
      (pBVar8->directive).numFlags = (NumericTokenFlags)NVar13.raw;
      (pBVar8->directive).rawLen = uVar14;
      (pBVar8->directive).info = pIVar5;
      pBVar8 = pBVar8 + 1;
    }
    memcpy((void *)((long)pBVar15 + lVar18 + 0x18),pos,((lVar16 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar17;
  this->data_ = pBVar15;
  return (pointer)((long)pBVar15 + lVar18);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}